

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O0

void __thiscall cmInstallFilesGenerator::~cmInstallFilesGenerator(cmInstallFilesGenerator *this)

{
  cmInstallFilesGenerator *this_local;
  
  ~cmInstallFilesGenerator(this);
  operator_delete(this,0x130);
  return;
}

Assistant:

cmInstallFilesGenerator::~cmInstallFilesGenerator() = default;